

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

int nghttp2_frame_pack_priority(nghttp2_bufs *bufs,nghttp2_priority *frame)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  uint8_t *buf;
  
  pnVar2 = bufs->head;
  if (pnVar2 != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x1b6,"int nghttp2_frame_pack_priority(nghttp2_bufs *, nghttp2_priority *)");
  }
  if (4 < (ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last)) {
    buf = (pnVar2->buf).pos + -9;
    (pnVar2->buf).pos = buf;
    nghttp2_frame_pack_frame_hd(buf,&frame->hd);
    nghttp2_frame_pack_priority_spec((pnVar2->buf).last,&frame->pri_spec);
    ppuVar1 = &(pnVar2->buf).last;
    *ppuVar1 = *ppuVar1 + 5;
    return 0;
  }
  __assert_fail("nghttp2_buf_avail(buf) >= NGHTTP2_PRIORITY_SPECLEN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x1ba,"int nghttp2_frame_pack_priority(nghttp2_bufs *, nghttp2_priority *)");
}

Assistant:

int nghttp2_frame_pack_priority(nghttp2_bufs *bufs, nghttp2_priority *frame) {
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= NGHTTP2_PRIORITY_SPECLEN);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_frame_pack_priority_spec(buf->last, &frame->pri_spec);

  buf->last += NGHTTP2_PRIORITY_SPECLEN;

  return 0;
}